

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::_::ChainPromiseNode::ChainPromiseNode
          (ChainPromiseNode *this,Own<kj::_::PromiseNode> *innerParam)

{
  PromiseNode *pPVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  EventLoop *pEVar5;
  
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR___cxa_pure_virtual_00628b18;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_006287b0;
  pEVar5 = anon_unknown_54::currentEventLoop();
  (this->super_Event).loop = pEVar5;
  (this->super_Event).next = (Event *)0x0;
  (this->super_Event).prev = (Event **)0x0;
  (this->super_Event).firing = false;
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00628920;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_00628958;
  *(undefined4 *)&(this->super_Event).field_0x24 = 0;
  uVar2 = *(undefined4 *)((long)&innerParam->disposer + 4);
  uVar3 = *(undefined4 *)&innerParam->ptr;
  uVar4 = *(undefined4 *)((long)&innerParam->ptr + 4);
  *(undefined4 *)&(this->inner).disposer = *(undefined4 *)&innerParam->disposer;
  *(undefined4 *)((long)&(this->inner).disposer + 4) = uVar2;
  *(undefined4 *)&(this->inner).ptr = uVar3;
  *(undefined4 *)((long)&(this->inner).ptr + 4) = uVar4;
  innerParam->ptr = (PromiseNode *)0x0;
  this->onReadyEvent = (Event *)0x0;
  this->selfPtr = (Own<kj::_::PromiseNode> *)0x0;
  pPVar1 = (this->inner).ptr;
  (*pPVar1->_vptr_PromiseNode[1])(pPVar1,&this->inner);
  pPVar1 = (this->inner).ptr;
  (**pPVar1->_vptr_PromiseNode)(pPVar1,&this->super_Event);
  return;
}

Assistant:

ChainPromiseNode::ChainPromiseNode(Own<PromiseNode> innerParam)
    : state(STEP1), inner(kj::mv(innerParam)) {
  inner->setSelfPointer(&inner);
  inner->onReady(this);
}